

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

uint us_internal_accept_poll_event(us_poll_t *p)

{
  us_poll_t *in_RDI;
  int read_length;
  uint64_t buf;
  int fd;
  uint local_18 [3];
  int local_c;
  
  local_c = us_poll_fd(in_RDI);
  read(local_c,local_18,8);
  return local_18[0];
}

Assistant:

unsigned int us_internal_accept_poll_event(struct us_poll_t *p) {
#ifdef LIBUS_USE_EPOLL
    int fd = us_poll_fd(p);
    uint64_t buf;
    int read_length = read(fd, &buf, 8);
    (void)read_length;
    return buf;
#else
    /* Kqueue has no underlying FD for timers or user events */
    return 0;
#endif
}